

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingRushSolution.cpp
# Opt level: O2

int shopping<std::multiset<std::pair<ToyStoreProduct,int>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>>
              (timed_mutex *buy_mx,
              multiset<std::pair<ToyStoreProduct,_int>,_std::less<std::pair<ToyStoreProduct,_int>_>,_std::allocator<std::pair<ToyStoreProduct,_int>_>_>
              *shop,string *shopname,int *budget,int threadid)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  iterator elit;
  unique_lock<std::timed_mutex> buy_lock;
  const_iterator local_58;
  int *local_50;
  string *local_48;
  unique_lock<std::timed_mutex> local_40;
  
  local_50 = budget;
  local_48 = shopname;
  do {
    local_40._M_owns = false;
    local_58._M_node = (_Base_ptr)0x64;
    local_40._M_device = buy_mx;
    bVar4 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                      (&local_40,(duration<long,_std::ratio<1L,_1000L>_> *)&local_58);
    if (bVar4) {
      uVar2 = (shop->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      if (uVar2 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
        poVar7 = std::operator<<(poVar7,"] no more products in this shop");
        bVar3 = true;
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      else {
        local_58._M_node = (shop->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar5 = rand();
        std::__advance<std::_Rb_tree_const_iterator<std::pair<ToyStoreProduct,int>>,long>
                  (&local_58,(ulong)(long)iVar5 % uVar2);
        iVar5 = *local_50;
        iVar1 = *(int *)&local_58._M_node[1].field_0x4;
        iVar6 = iVar5 - iVar1;
        bVar3 = iVar6 == 0 || iVar5 < iVar1;
        if (iVar6 == 0 || iVar5 < iVar1) {
          poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
          poVar7 = std::operator<<(poVar7,"] budget exhausted");
        }
        else {
          *local_50 = iVar6;
          std::
          _Rb_tree<std::pair<ToyStoreProduct,int>,std::pair<ToyStoreProduct,int>,std::_Identity<std::pair<ToyStoreProduct,int>>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
          ::erase_abi_cxx11_((_Rb_tree<std::pair<ToyStoreProduct,int>,std::pair<ToyStoreProduct,int>,std::_Identity<std::pair<ToyStoreProduct,int>>,std::less<std::pair<ToyStoreProduct,int>>,std::allocator<std::pair<ToyStoreProduct,int>>>
                              *)shop,local_58);
          poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = std::operator<<(poVar7,(string *)local_48);
          poVar7 = std::operator<<(poVar7,"] bought item, new budget ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,*local_50);
        }
        std::endl<char,std::char_traits<char>>(poVar7);
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"[T ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,threadid);
      poVar7 = std::operator<<(poVar7,", ");
      poVar7 = std::operator<<(poVar7,(string *)local_48);
      poVar7 = std::operator<<(poVar7,"] timeout");
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar3 = false;
    }
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_40);
  } while ((!bVar3) && (bVar4));
  return (int)!bVar4;
}

Assistant:

int shopping(std::timed_mutex& buy_mx, shop_t& shop,
             const std::string& shopname, int& budget, const int threadid) {
  bool checkout = false;

  while (!checkout) {
    // try to buy things, but only if shop is not empty

    // be careful, erase modifies the shop, hence lock here
    std::unique_lock<std::timed_mutex> buy_lock(buy_mx, std::defer_lock);

    if (!buy_lock.try_lock_for(std::chrono::milliseconds(PATIENCE))) {
      std::cout << "[T " << threadid << ", " << shopname << "] timeout"
                << std::endl;
      return TIMEOUT;
    }

    size_t size = shop.size();
    if (size != 0) {
      auto elit = shop.begin();
      // find random product in shop
      std::advance(elit, (std::rand() % size));
      if (std::get<1>(*elit) < budget) {
        budget -= std::get<1>(*elit);

        // remove item from shop
        shop.erase(elit);
        std::cout << "[T " << threadid << ", " << shopname
                  << "] bought item, new budget " << budget << std::endl;
      } else {
        std::cout << "[T " << threadid << "] budget exhausted" << std::endl;
        checkout = true;
      }
    } else {
      std::cout << "[T " << threadid << "] no more products in this shop"
                << std::endl;
      checkout = true;
    }
  }
  return CHECKOUT;
}